

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O3

void __thiscall
phmap::priv::(anonymous_namespace)::
multi_checker<phmap::btree_multiset<long,phmap::Less<long>,std::allocator<long>>,std::multiset<long,std::less<long>,std::allocator<long>>>
::
insert<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,true>>,long&,long*>>
          (multi_checker<phmap::btree_multiset<long,phmap::Less<long>,std::allocator<long>>,std::multiset<long,std::less<long>,std::allocator<long>>>
           *this,btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>,_long_&,_long_*>
                 b,btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>,_long_&,_long_*>
                   e)

{
  ulong uVar1;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>,_long_&,_long_*>
  local_30;
  
  uVar1 = b._8_8_;
  local_30.node = b.node;
  local_30.position = b.position;
  if (local_30.position != e.position || local_30.node != e.node) {
    do {
      if (((ulong)local_30.node & 7) != 0) {
        __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                      ,0xf84,
                      "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<long, phmap::Less<long>, std::allocator<long>, 256, true>> *, unsigned char, long, phmap::priv::btree_node<phmap::priv::set_params<long, phmap::Less<long>, std::allocator<long>, 256, true>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<long, phmap::Less<long>, std::allocator<long>, 256, true>> *, unsigned char, long, phmap::priv::btree_node<phmap::priv::set_params<long, phmap::Less<long>, std::allocator<long>, 256, true>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = char]"
                     );
      }
      anon_unknown_0::
      multi_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
      ::insert((multi_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
                *)this,(value_type *)(local_30.node + (long)(int)uVar1 * 8 + 0x10));
      btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>,_long_&,_long_*>
      ::increment(&local_30);
      uVar1 = (ulong)(uint)local_30.position;
    } while (local_30.position != e.position || local_30.node != e.node);
  }
  return;
}

Assistant:

void insert(InputIterator b, InputIterator e) {
            for (; b != e; ++b) {
                insert(*b);
            }
        }